

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O0

void __thiscall
ScopeLocal::makeNameRecommendationsForSymbols
          (ScopeLocal *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *resname,vector<Symbol_*,_std::allocator<Symbol_*>_> *ressym)

{
  Varnode *this_00;
  Funcdata *fd;
  bool bVar1;
  bool bVar2;
  int4 s;
  reference ppVar3;
  Address *this_01;
  reference ppVVar4;
  Address *pAVar5;
  uint8 h;
  HighVariable *pHVar6;
  undefined1 local_180 [32];
  Symbol *local_160;
  Symbol *sym_1;
  Varnode *vn_1;
  DynamicRecommend *dynEntry;
  _Self local_138;
  _List_node_base *local_130;
  undefined1 local_128 [8];
  DynamicHash dhash;
  const_iterator dyniter;
  Symbol *sym;
  Varnode *vn;
  int4 size;
  Address *useaddr;
  Address *addr;
  const_iterator cStack_48;
  bool isaddrtied;
  const_iterator eiter;
  const_iterator biter;
  _Rb_tree_const_iterator<std::pair<const_AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  const_iterator iter;
  vector<Symbol_*,_std::allocator<Symbol_*>_> *ressym_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *resname_local;
  ScopeLocal *this_local;
  
  iter._M_node = (_Base_ptr)ressym;
  std::
  _Rb_tree_const_iterator<std::pair<const_AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_const_iterator(&local_28);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<AddressUsePointPair>,_std::allocator<std::pair<const_AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(&this->nameRecommend);
  do {
    biter._M_node =
         (_Base_ptr)
         std::
         map<AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<AddressUsePointPair>,_std::allocator<std::pair<const_AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->nameRecommend);
    bVar1 = std::operator!=(&local_28,(_Self *)&biter);
    if (!bVar1) {
      bVar1 = std::__cxx11::list<DynamicRecommend,_std::allocator<DynamicRecommend>_>::empty
                        (&this->dynRecommend);
      if (!bVar1) {
        std::_List_const_iterator<DynamicRecommend>::_List_const_iterator
                  ((_List_const_iterator<DynamicRecommend> *)&dhash.hash);
        DynamicHash::DynamicHash((DynamicHash *)local_128);
        local_130 = (_List_node_base *)
                    std::__cxx11::list<DynamicRecommend,_std::allocator<DynamicRecommend>_>::begin
                              (&this->dynRecommend);
        dhash.hash = (uint8)local_130;
        while( true ) {
          local_138._M_node =
               (_List_node_base *)
               std::__cxx11::list<DynamicRecommend,_std::allocator<DynamicRecommend>_>::end
                         (&this->dynRecommend);
          bVar1 = std::operator!=((_Self *)&dhash.hash,&local_138);
          if (!bVar1) break;
          DynamicHash::clear((DynamicHash *)local_128);
          vn_1 = (Varnode *)
                 std::_List_const_iterator<DynamicRecommend>::operator*
                           ((_List_const_iterator<DynamicRecommend> *)&dhash.hash);
          fd = (this->super_ScopeInternal).super_Scope.fd;
          pAVar5 = DynamicRecommend::getAddress((DynamicRecommend *)vn_1);
          h = DynamicRecommend::getHash((DynamicRecommend *)vn_1);
          sym_1 = (Symbol *)DynamicHash::findVarnode((DynamicHash *)local_128,fd,pAVar5,h);
          if (((Varnode *)sym_1 != (Varnode *)0x0) &&
             (bVar1 = Varnode::isAnnotation((Varnode *)sym_1), !bVar1)) {
            pHVar6 = Varnode::getHigh((Varnode *)sym_1);
            local_160 = HighVariable::getSymbol(pHVar6);
            if ((local_160 != (Symbol *)0x0) && (bVar1 = Symbol::isNameUndefined(local_160), bVar1))
            {
              DynamicRecommend::getName_abi_cxx11_((DynamicRecommend *)local_180);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(resname,(value_type *)local_180);
              std::__cxx11::string::~string((string *)local_180);
              std::vector<Symbol_*,_std::allocator<Symbol_*>_>::push_back
                        ((vector<Symbol_*,_std::allocator<Symbol_*>_> *)iter._M_node,&local_160);
            }
          }
          std::_List_const_iterator<DynamicRecommend>::operator++
                    ((_List_const_iterator<DynamicRecommend> *)&dhash.hash);
        }
        DynamicHash::~DynamicHash((DynamicHash *)local_128);
      }
      return;
    }
    std::_Rb_tree_const_iterator<Varnode_*>::_Rb_tree_const_iterator(&eiter);
    std::_Rb_tree_const_iterator<Varnode_*>::_Rb_tree_const_iterator(&stack0xffffffffffffffb8);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&local_28);
    pAVar5 = AddressUsePointPair::getAddr(&ppVar3->first);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&local_28);
    this_01 = AddressUsePointPair::getUseAddr(&ppVar3->first);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&local_28);
    s = AddressUsePointPair::getSize(&ppVar3->first);
    bVar1 = Address::isInvalid(this_01);
    if (bVar1) {
      eiter = Funcdata::beginLoc((this->super_ScopeInternal).super_Scope.fd,s,pAVar5);
      cStack_48 = Funcdata::endLoc((this->super_ScopeInternal).super_Scope.fd,s,pAVar5);
    }
    else {
      eiter = Funcdata::beginLoc((this->super_ScopeInternal).super_Scope.fd,s,pAVar5,this_01,
                                 0xffffffff);
      cStack_48 = Funcdata::endLoc((this->super_ScopeInternal).super_Scope.fd,s,pAVar5,this_01,
                                   0xffffffff);
    }
    while (bVar2 = std::operator!=(&eiter,&stack0xffffffffffffffb8), bVar2) {
      ppVVar4 = std::_Rb_tree_const_iterator<Varnode_*>::operator*(&eiter);
      this_00 = *ppVVar4;
      bVar2 = Varnode::isAnnotation(this_00);
      if (!bVar2) {
        pHVar6 = Varnode::getHigh(this_00);
        dyniter._M_node = (_List_node_base *)HighVariable::getSymbol(pHVar6);
        if (((Symbol *)dyniter._M_node != (Symbol *)0x0) &&
           (bVar2 = Symbol::isNameUndefined((Symbol *)dyniter._M_node), bVar2)) {
          ppVar3 = std::
                   _Rb_tree_const_iterator<std::pair<const_AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator*(&local_28);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(resname,&ppVar3->second);
          std::vector<Symbol_*,_std::allocator<Symbol_*>_>::push_back
                    ((vector<Symbol_*,_std::allocator<Symbol_*>_> *)iter._M_node,
                     (value_type *)&dyniter);
          break;
        }
      }
      if (bVar1) break;
      std::_Rb_tree_const_iterator<Varnode_*>::operator++(&eiter);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_AddressUsePointPair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

void ScopeLocal::makeNameRecommendationsForSymbols(vector<string> &resname,vector<Symbol *> &ressym) const

{ 				// Find nameable symbols with a varnode rep matching a name recommendation
  map<AddressUsePointPair,string>::const_iterator iter;
  for(iter=nameRecommend.begin();iter!=nameRecommend.end();++iter) {
    VarnodeLocSet::const_iterator biter,eiter;
    bool isaddrtied;
    const Address &addr((*iter).first.getAddr());
    const Address &useaddr((*iter).first.getUseAddr());
    int4 size = (*iter).first.getSize();
    if (useaddr.isInvalid()) {
      isaddrtied = true;
      biter = fd->beginLoc(size,addr);
      eiter = fd->endLoc(size,addr);
    }
    else {
      isaddrtied = false;
      biter = fd->beginLoc(size,addr,useaddr);
      eiter = fd->endLoc(size,addr,useaddr);
    }
    while(biter != eiter) {
      Varnode *vn = *biter;
      if (!vn->isAnnotation()) {
	Symbol *sym = vn->getHigh()->getSymbol();
	if (sym != (Symbol *)0) {
	  if (sym->isNameUndefined()) {
	    resname.push_back( (*iter).second);
	    ressym.push_back(sym);
	    break;
	  }
	}
      }
      if (isaddrtied) break;
      ++biter;
    }
  }

  if (dynRecommend.empty()) return;

  list<DynamicRecommend>::const_iterator dyniter;
  DynamicHash dhash;
  for(dyniter=dynRecommend.begin();dyniter!=dynRecommend.end();++dyniter) {
    dhash.clear();
    const DynamicRecommend &dynEntry(*dyniter);
    Varnode *vn = dhash.findVarnode(fd, dynEntry.getAddress(), dynEntry.getHash());
    if (vn == (Varnode *)0) continue;
    if (vn->isAnnotation()) continue;
    Symbol *sym = vn->getHigh()->getSymbol();
    if (sym != (Symbol *)0) {
      if (sym->isNameUndefined()) {
	resname.push_back( dynEntry.getName() );
	ressym.push_back(sym);
      }
    }
  }
}